

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O1

_Bool X86_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *_info)

{
  cs_detail *pcVar1;
  cs_insn *pcVar2;
  DisassemblerMode mode;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  x86_reg xVar7;
  uint Op;
  long lVar8;
  InternalInstruction insn;
  uint8_t *local_a30;
  size_t local_a28;
  uint64_t local_a20;
  InternalInstruction local_a18;
  
  local_a30 = code;
  local_a28 = code_len;
  local_a20 = address;
  memset(&local_a18,0,0x938);
  pcVar1 = instr->flat_insn->detail;
  if (pcVar1 != (cs_detail *)0x0) {
    (pcVar1->field_6).x86.op_count = '\0';
    (instr->flat_insn->detail->field_6).x86.sse_cc = X86_SSE_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_cc = X86_AVX_CC_INVALID;
    (instr->flat_insn->detail->field_6).x86.avx_sae = false;
    (instr->flat_insn->detail->field_6).x86.avx_rm = X86_AVX_RM_INVALID;
    (instr->flat_insn->detail->field_6).arm64.cc = ARM64_CC_INVALID;
    (instr->flat_insn->detail->field_6).arm.vector_size = 0;
    memset((void *)((long)&instr->flat_insn->detail->field_6 + 0x30),0,0x180);
  }
  mode = ((*(uint *)(ud + 4) & 4) == 0) + MODE_32BIT;
  if ((*(uint *)(ud + 4) & 2) != 0) {
    mode = MODE_16BIT;
  }
  iVar5 = decodeInstruction(&local_a18,reader,&local_a30,address,mode);
  if (iVar5 != 0) {
    *size = (short)local_a18.readerCursor - (short)address;
    return false;
  }
  *size = (uint16_t)local_a18.length;
  bVar3 = true;
  if (local_a18.spec == (InstructionSpecifier *)0x0) goto LAB_001a4a7c;
  MCInst_setOpcode(instr,(uint)local_a18.instructionID);
  if (local_a18.xAcquireRelease == true) {
    uVar6 = MCInst_getOpcode(instr);
    Op = 0x186f;
    if (uVar6 != 0x943) {
      uVar6 = MCInst_getOpcode(instr);
      Op = 0x1828;
      if (uVar6 != 0x93b) goto LAB_001a4a3e;
    }
    MCInst_setOpcode(instr,Op);
  }
LAB_001a4a3e:
  local_a18.numImmediatesTranslated = '\0';
  lVar8 = 0;
  do {
    if (((&(local_a18.operands)->encoding)[lVar8] != '\0') &&
       (_Var4 = translateOperand(instr,(OperandSpecifier *)(&(local_a18.operands)->encoding + lVar8)
                                 ,&local_a18), _Var4)) goto LAB_001a4a7c;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 10);
  bVar3 = false;
LAB_001a4a7c:
  if (!bVar3) {
    instr->imm_size = local_a18.immSize;
    if (*(int *)(ud + 0xe0) == 0) {
      instr->x86_prefix[0] = local_a18.prefix0;
      instr->x86_prefix[1] = local_a18.prefix1;
      instr->x86_prefix[2] = local_a18.prefix2;
      instr->x86_prefix[3] = local_a18.prefix3;
    }
    else {
      pcVar2 = instr->flat_insn;
      instr->x86_prefix[0] = local_a18.prefix0;
      instr->x86_prefix[1] = local_a18.prefix1;
      instr->x86_prefix[2] = local_a18.prefix2;
      instr->x86_prefix[3] = local_a18.prefix3;
      if (local_a18.vectorExtensionType == TYPE_NO_VEX_XOP) {
        if (local_a18.twoByteEscape == '\0') {
          (pcVar2->detail->field_6).x86.opcode[0] = local_a18.opcode;
        }
        else {
          (pcVar2->detail->field_6).x86.opcode[0] = local_a18.twoByteEscape;
          if (local_a18.threeByteEscape == '\0') {
            (pcVar2->detail->field_6).x86.opcode[1] = local_a18.opcode;
          }
          else {
            (pcVar2->detail->field_6).x86.opcode[1] = local_a18.threeByteEscape;
            (pcVar2->detail->field_6).x86.opcode[2] = local_a18.opcode;
          }
        }
      }
      else {
        (pcVar2->detail->field_6).arm.vector_size = (int)local_a18.vectorExtensionPrefix;
      }
      (pcVar2->detail->field_6).x86.rex = local_a18.rexPrefix;
      (pcVar2->detail->field_6).x86.addr_size = local_a18.addressSize;
      (pcVar2->detail->field_6).x86.modrm = local_a18.orgModRM;
      (pcVar2->detail->field_6).x86.sib = local_a18.sib;
      (pcVar2->detail->field_6).x86.disp = local_a18.displacement;
      xVar7 = x86_map_sib_index(local_a18.sibIndex);
      (pcVar2->detail->field_6).x86.sib_index = xVar7;
      (pcVar2->detail->field_6).x86.sib_scale = local_a18.sibScale;
      xVar7 = x86_map_sib_base(local_a18.sibBase);
      (pcVar2->detail->field_6).x86.sib_base = xVar7;
    }
  }
  return (_Bool)(bVar3 ^ 1);
}

Assistant:

bool X86_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *_info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;
	InternalInstruction insn;
	struct reader_info info;
	int ret;
	bool result;

	info.code = code;
	info.size = code_len;
	info.offset = address;

	memset(&insn, 0, offsetof(InternalInstruction, reader));

	if (instr->flat_insn->detail) {
		instr->flat_insn->detail->x86.op_count = 0;
		instr->flat_insn->detail->x86.sse_cc = X86_SSE_CC_INVALID;
		instr->flat_insn->detail->x86.avx_cc = X86_AVX_CC_INVALID;
		instr->flat_insn->detail->x86.avx_sae = false;
		instr->flat_insn->detail->x86.avx_rm = X86_AVX_RM_INVALID;

		memset(instr->flat_insn->detail->x86.prefix, 0, sizeof(instr->flat_insn->detail->x86.prefix));
		memset(instr->flat_insn->detail->x86.opcode, 0, sizeof(instr->flat_insn->detail->x86.opcode));
		memset(instr->flat_insn->detail->x86.operands, 0, sizeof(instr->flat_insn->detail->x86.operands));
	}

	if (handle->mode & CS_MODE_16)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_16BIT);
	else if (handle->mode & CS_MODE_32)
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_32BIT);
	else
		ret = decodeInstruction(&insn,
				reader, &info,
				address,
				MODE_64BIT);

	if (ret) {
		*size = (uint16_t)(insn.readerCursor - address);

		return false;
	} else {
		*size = (uint16_t)insn.length;

		result = (!translateInstruction(instr, &insn)) ?  true : false;
		if (result) {
			instr->imm_size = insn.immSize;
			if (handle->detail) {
				update_pub_insn(instr->flat_insn, &insn, instr->x86_prefix);
			} else {
				// still copy all prefixes
				instr->x86_prefix[0] = insn.prefix0;
				instr->x86_prefix[1] = insn.prefix1;
				instr->x86_prefix[2] = insn.prefix2;
				instr->x86_prefix[3] = insn.prefix3;
			}
		}

		return result;
	}
}